

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CMainClass *stm)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  ClassInfo *this_00;
  VariablesInfo *this_01;
  element_type *peVar4;
  pointer pCVar5;
  shared_ptr<MethodInfo> local_68;
  shared_ptr<MethodInfo> local_58;
  shared_ptr<VariablesInfo> local_48 [2];
  shared_ptr<ClassInfo> local_28;
  CMainClass *local_18;
  CMainClass *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CMainClass *)this;
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::__cxx11::string::operator=((string *)&peVar2->iName,"");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->id);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->id);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  this_00 = (ClassInfo *)operator_new(0x88);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  ClassInfo::ClassInfo(this_00,&peVar2->iName);
  std::shared_ptr<ClassInfo>::shared_ptr<ClassInfo,void>(&local_28,this_00);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<ClassInfo>::operator=(&peVar2->iClass,&local_28);
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_28);
  this_01 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(this_01);
  std::shared_ptr<VariablesInfo>::shared_ptr<VariablesInfo,void>(local_48,this_01);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar4 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  std::shared_ptr<VariablesInfo>::operator=(&peVar4->fields,local_48);
  std::shared_ptr<VariablesInfo>::~shared_ptr(local_48);
  std::shared_ptr<MethodInfo>::shared_ptr(&local_58,(nullptr_t)0x0);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<MethodInfo>::operator=(&peVar2->iMethod,&local_58);
  std::shared_ptr<MethodInfo>::~shared_ptr(&local_58);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->mainMethod);
  if (bVar1) {
    pCVar5 = std::unique_ptr<CMainMethod,_std::default_delete<CMainMethod>_>::operator->
                       (&local_18->mainMethod);
    (**(pCVar5->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
  }
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar4 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<MethodInfo>::shared_ptr(&local_68,&peVar2->iMethod);
  ClassInfo::AddMethod(peVar4,&local_68);
  std::shared_ptr<MethodInfo>::~shared_ptr(&local_68);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CMainClass &stm )
{
//	std::cout << "mainclass\n";
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iClass = std::shared_ptr<ClassInfo>( new ClassInfo( info->iName ) );
	info->iClass->fields = std::shared_ptr<VariablesInfo>( new VariablesInfo() );

	info->iMethod = nullptr;
	if( stm.mainMethod ) {
		stm.mainMethod->Accept( *this );
	}
	info->iClass->AddMethod( info->iMethod );
}